

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

curl_slist * Curl_ossl_engines_list(Curl_easy *data)

{
  char *data_00;
  curl_slist *pcVar1;
  ENGINE *local_30;
  ENGINE *e;
  curl_slist *beg;
  curl_slist *list;
  Curl_easy *data_local;
  
  beg = (curl_slist *)0x0;
  local_30 = ENGINE_get_first();
  while( true ) {
    if (local_30 == (ENGINE *)0x0) {
      return beg;
    }
    data_00 = ENGINE_get_id(local_30);
    pcVar1 = curl_slist_append(beg,data_00);
    if (pcVar1 == (curl_slist *)0x0) break;
    local_30 = ENGINE_get_next(local_30);
    beg = pcVar1;
  }
  curl_slist_free_all(beg);
  return (curl_slist *)0x0;
}

Assistant:

struct curl_slist *Curl_ossl_engines_list(struct Curl_easy *data)
{
  struct curl_slist *list = NULL;
#if defined(USE_OPENSSL) && defined(HAVE_OPENSSL_ENGINE_H)
  struct curl_slist *beg;
  ENGINE *e;

  for(e = ENGINE_get_first(); e; e = ENGINE_get_next(e)) {
    beg = curl_slist_append(list, ENGINE_get_id(e));
    if(!beg) {
      curl_slist_free_all(list);
      return NULL;
    }
    list = beg;
  }
#endif
  (void) data;
  return list;
}